

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O3

void av1_compute_feature_segmentation_map
               (uint8_t *segment_map,int width,int height,int *inliers,int num_inliers)

{
  byte bVar1;
  ulong uVar2;
  uint8_t *puVar3;
  int iVar4;
  ulong uVar5;
  
  memset(segment_map,0,(long)height * (long)width);
  if (0 < num_inliers) {
    uVar2 = 0;
    do {
      segment_map[(inliers[uVar2 * 2 + 1] >> 5) * width + (inliers[uVar2 * 2] >> 5)] =
           segment_map[(inliers[uVar2 * 2 + 1] >> 5) * width + (inliers[uVar2 * 2] >> 5)] + '\x01';
      uVar2 = uVar2 + 1;
    } while ((uint)num_inliers != uVar2);
  }
  if (0 < height) {
    uVar2 = 0;
    iVar4 = 0;
    puVar3 = segment_map;
    do {
      if (0 < width) {
        uVar5 = 0;
        do {
          bVar1 = puVar3[uVar5];
          puVar3[uVar5] = 2 < bVar1;
          iVar4 = iVar4 + (uint)(2 < bVar1);
          uVar5 = uVar5 + 1;
        } while ((uint)width != uVar5);
      }
      uVar2 = uVar2 + 1;
      puVar3 = puVar3 + (uint)width;
    } while (uVar2 != (uint)height);
    if (0x2f < iVar4) {
      return;
    }
  }
  memset(segment_map,1,(long)(height * width));
  return;
}

Assistant:

void av1_compute_feature_segmentation_map(uint8_t *segment_map, int width,
                                          int height, int *inliers,
                                          int num_inliers) {
  int seg_count = 0;
  memset(segment_map, 0, sizeof(*segment_map) * width * height);

  for (int i = 0; i < num_inliers; i++) {
    int x = inliers[i * 2];
    int y = inliers[i * 2 + 1];
    int seg_x = x >> WARP_ERROR_BLOCK_LOG;
    int seg_y = y >> WARP_ERROR_BLOCK_LOG;
    segment_map[seg_y * width + seg_x] += 1;
  }

  for (int i = 0; i < height; i++) {
    for (int j = 0; j < width; j++) {
      uint8_t feat_count = segment_map[i * width + j];
      segment_map[i * width + j] = (feat_count >= FEAT_COUNT_TR);
      seg_count += (segment_map[i * width + j]);
    }
  }

  // If this motion does not make up a large enough portion of the frame,
  // use the unsegmented version of the error metric
  if (seg_count < SEG_COUNT_TR)
    memset(segment_map, 1, width * height * sizeof(*segment_map));
}